

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_open_filename.c
# Opt level: O0

int64_t file_skip(archive *a,void *client_data,int64_t request)

{
  read_file_data *mine;
  int64_t request_local;
  void *client_data_local;
  archive *a_local;
  
  if (*(char *)((long)client_data + 0x1c) == '\0') {
    a_local = (archive *)0x0;
  }
  else {
    a_local = (archive *)file_skip_lseek(a,client_data,request);
  }
  return (int64_t)a_local;
}

Assistant:

static int64_t
file_skip(struct archive *a, void *client_data, int64_t request)
{
	struct read_file_data *mine = (struct read_file_data *)client_data;

	/* Delegate skip requests. */
	if (mine->use_lseek)
		return (file_skip_lseek(a, client_data, request));

	/* If we can't skip, return 0; libarchive will read+discard instead. */
	return (0);
}